

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O1

bool NeedIoC(void)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  
  cVar1 = *lp;
  pcVar4 = lp;
  while ((byte)(cVar1 - 1U) < 0x20) {
    pcVar4 = pcVar4 + 1;
    cVar1 = *pcVar4;
  }
  lp = pcVar4;
  if (((*pcVar4 == '(') && (iVar3 = tolower((uint)(byte)pcVar4[1]), iVar3 == 99)) &&
     (pcVar4[2] == ')')) {
    lp = pcVar4 + 3;
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool NeedIoC() {
	SkipBlanks();
	if ('(' != lp[0] || 'c' != tolower((byte)lp[1]) || ')' != lp[2]) return false;
	lp += 3;
	return true;
}